

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::nextImage
          (TextureImageIterator *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int i;
  long lVar5;
  int iVar6;
  IVec3 size;
  
  iVar6 = this->m_currentLevel;
  bVar2 = iVar6 < this->m_levelCount + -1;
  iVar1 = this->m_currentImage;
  bVar3 = iVar1 < this->m_levelImageCount + -1;
  if ((bVar3 || bVar2) && (this->m_currentImage = iVar1 + 1, iVar1 + 1 == this->m_levelImageCount))
  {
    this->m_currentLevel = iVar6 + 1;
    this->m_currentImage = 0;
    size.m_data[2] = 0;
    size.m_data[0] = 0;
    size.m_data[1] = 0;
    lVar5 = 0;
    bVar4 = (byte)(iVar6 + 1);
    if ((this->m_info).m_target == 0x8c1a) {
      do {
        iVar6 = (this->m_info).m_size.m_data[lVar5] >> (bVar4 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        size.m_data[lVar5] = iVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      size.m_data[2] = (this->m_info).m_size.m_data[2];
    }
    else {
      do {
        iVar6 = (this->m_info).m_size.m_data[lVar5] >> (bVar4 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        size.m_data[lVar5] = iVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    (this->m_levelSize).m_data[2] = size.m_data[2];
    *(undefined8 *)(this->m_levelSize).m_data = size.m_data._0_8_;
    iVar6 = 6;
    if ((this->m_info).m_target != 0x8513) {
      iVar6 = (this->m_levelSize).m_data[2];
    }
    this->m_levelImageCount = iVar6;
  }
  return bVar3 || bVar2;
}

Assistant:

bool				hasNextImage			(void) const					{ return (m_currentLevel < (m_levelCount - 1)) || m_currentImage < (m_levelImageCount - 1); }